

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

int mbedtls_ecp_check_pubkey(mbedtls_ecp_group *grp,mbedtls_ecp_point *pt)

{
  mbedtls_mpi *X;
  mbedtls_mpi *Y;
  mbedtls_mpi_uint *pmVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  mbedtls_mpi YY;
  mbedtls_mpi local_60;
  mbedtls_mpi local_48;
  
  iVar2 = mbedtls_mpi_cmp_int(&pt->Z,1);
  iVar3 = -0x4c80;
  if (iVar2 == 0) {
    pmVar1 = (grp->G).X.p;
    iVar3 = -0x4f80;
    if (pmVar1 != (mbedtls_mpi_uint *)0x0) {
      if ((grp->G).Y.p == (mbedtls_mpi_uint *)0x0) {
        sVar4 = mbedtls_mpi_size(&pt->X);
        iVar3 = -0x4c80;
        if (sVar4 <= grp->nbits + 7 >> 3) {
          iVar3 = 0;
        }
      }
      else if ((pmVar1 != (mbedtls_mpi_uint *)0x0) && ((grp->G).Y.p != (mbedtls_mpi_uint *)0x0)) {
        iVar2 = mbedtls_mpi_cmp_int(&pt->X,0);
        iVar3 = -0x4c80;
        if (-1 < iVar2) {
          X = &pt->Y;
          iVar2 = mbedtls_mpi_cmp_int(X,0);
          if (-1 < iVar2) {
            Y = &grp->P;
            iVar2 = mbedtls_mpi_cmp_mpi(&pt->X,Y);
            if ((iVar2 < 0) && (iVar2 = mbedtls_mpi_cmp_mpi(X,Y), iVar2 < 0)) {
              mbedtls_mpi_init(&local_48);
              mbedtls_mpi_init(&local_60);
              iVar3 = mbedtls_mpi_mul_mpi(&local_48,X,X);
              if ((iVar3 == 0) && (iVar3 = ecp_modp(&local_48,grp), iVar3 == 0)) {
                mul_count = mul_count + 1;
                iVar3 = 0;
              }
              if (iVar3 == 0) {
                iVar3 = mbedtls_mpi_mul_mpi(&local_60,&pt->X,&pt->X);
                if ((iVar3 == 0) && (iVar3 = ecp_modp(&local_60,grp), iVar3 == 0)) {
                  mul_count = mul_count + 1;
                  iVar3 = 0;
                }
                if (iVar3 == 0) {
                  if ((grp->A).p == (mbedtls_mpi_uint *)0x0) {
                    iVar3 = mbedtls_mpi_sub_int(&local_60,&local_60,3);
                    if (iVar3 == 0) {
                      do {
                        if ((-1 < local_60.s) ||
                           (iVar3 = mbedtls_mpi_cmp_int(&local_60,0), iVar3 == 0))
                        goto LAB_001094da;
                        iVar3 = mbedtls_mpi_add_mpi(&local_60,&local_60,Y);
                      } while (iVar3 == 0);
                    }
                  }
                  else {
                    iVar3 = mbedtls_mpi_add_mod(grp,&local_60,&local_60,&grp->A);
                    if (iVar3 == 0) {
LAB_001094da:
                      iVar3 = mbedtls_mpi_mul_mod(grp,&local_60,&local_60,&pt->X);
                      if ((iVar3 == 0) &&
                         (iVar3 = mbedtls_mpi_add_mod(grp,&local_60,&local_60,&grp->B), iVar3 == 0))
                      {
                        iVar2 = mbedtls_mpi_cmp_mpi(&local_48,&local_60);
                        iVar3 = -0x4c80;
                        if (iVar2 == 0) {
                          iVar3 = 0;
                        }
                      }
                    }
                  }
                }
              }
              mbedtls_mpi_free(&local_48);
              mbedtls_mpi_free(&local_60);
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_ecp_check_pubkey( const mbedtls_ecp_group *grp,
                              const mbedtls_ecp_point *pt )
{
    ECP_VALIDATE_RET( grp != NULL );
    ECP_VALIDATE_RET( pt  != NULL );

    /* Must use affine coordinates */
    if( mbedtls_mpi_cmp_int( &pt->Z, 1 ) != 0 )
        return( MBEDTLS_ERR_ECP_INVALID_KEY );

#if defined(ECP_MONTGOMERY)
    if( mbedtls_ecp_get_type( grp ) == MBEDTLS_ECP_TYPE_MONTGOMERY )
        return( ecp_check_pubkey_mx( grp, pt ) );
#endif
#if defined(ECP_SHORTWEIERSTRASS)
    if( mbedtls_ecp_get_type( grp ) == MBEDTLS_ECP_TYPE_SHORT_WEIERSTRASS )
        return( ecp_check_pubkey_sw( grp, pt ) );
#endif
    return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );
}